

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

natwm_error button_handle_resize_end(natwm_state *state,xcb_button_release_event_t *event)

{
  natwm_error err;
  int16_t offset_y;
  int16_t offset_x;
  xcb_button_release_event_t *event_local;
  natwm_state *state_local;
  
  if (state->button_state->grabbed_client == (client *)0x0) {
    state_local._4_4_ = NO_ERROR;
  }
  else {
    state_local._4_4_ =
         client_handle_resize
                   (state,state->button_state->grabbed_client,
                    event->event_x - state->button_state->start_x,
                    event->event_y - state->button_state->start_y);
    if (state_local._4_4_ == NO_ERROR) {
      hide_resize_helper(state);
      button_state_reset(state);
      state_local._4_4_ = NO_ERROR;
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to perform resize");
    }
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error button_handle_resize_end(struct natwm_state *state,
                                          const xcb_button_release_event_t *event)
{
        if (state->button_state->grabbed_client == NULL) {
                return NO_ERROR;
        }

        int16_t offset_x = (int16_t)(event->event_x - state->button_state->start_x);
        int16_t offset_y = (int16_t)(event->event_y - state->button_state->start_y);

        enum natwm_error err = client_handle_resize(
                state, state->button_state->grabbed_client, offset_x, offset_y);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to perform resize");

                return err;
        }

        hide_resize_helper(state);
        button_state_reset(state);

        return NO_ERROR;
}